

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

void __thiscall kj::InsertionOrderIndex::eraseImpl(InsertionOrderIndex *this,size_t pos)

{
  uint uVar1;
  uint uVar2;
  Link *pLVar3;
  
  pLVar3 = this->links;
  uVar1 = pLVar3[pos + 1].next;
  uVar2 = pLVar3[pos + 1].prev;
  pLVar3[uVar1].prev = uVar2;
  pLVar3[uVar2].next = uVar1;
  return;
}

Assistant:

void InsertionOrderIndex::eraseImpl(size_t pos) {
  Link& link = links[pos + 1];
  links[link.next].prev = link.prev;
  links[link.prev].next = link.next;

#ifdef KJ_DEBUG
  memset(&link, 0xff, sizeof(Link));
#endif
}